

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O3

void __thiscall
Js::StepController::Activate(StepController *this,StepType stepType,InterpreterHaltState *haltState)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  DiagStackFrame **ppDVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  FunctionBody *ptr;
  FunctionBody *this_00;
  StatementMap *pSVar7;
  DWORD_PTR DVar8;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *returnedValueList;
  StepController *this_01;
  
  this->stepType = stepType;
  iVar3 = InterpreterHaltState::GetCurrentOffset(haltState);
  this->byteOffset = iVar3;
  ppDVar5 = JsUtil::ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>::
            Item((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)
                 haltState->framePointers,
                 ((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)
                 haltState->framePointers)->count + -1);
  iVar3 = (*(*ppDVar5)->_vptr_DiagStackFrame[10])();
  this->pActivatedContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  if ((ScriptContext *)CONCAT44(extraout_var,iVar3) == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                ,0x5b,"(this->pActivatedContext)","this->pActivatedContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  ptr = InterpreterHaltState::GetFunction(haltState);
  Memory::RecyclerRootPtr<Js::FunctionBody>::Root(&this->body,ptr,this->pActivatedContext->recycler)
  ;
  this_00 = Memory::RecyclerRootPtr<Js::FunctionBody>::operator->(&this->body);
  pSVar7 = FunctionBody::GetMatchingStatementMapFromByteCode(this_00,this->byteOffset,false);
  this->statementMap = pSVar7;
  this_01 = (StepController *)haltState->framePointers;
  iVar3 = *(int *)&this_01->statementMap;
  this->frameCountWhenSet = iVar3;
  DVar8 = 0xffffffffffffffff;
  if (stepType != STEP_DOCUMENT) {
    ppDVar5 = JsUtil::ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>::
              Item((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)
                   this_01,iVar3 + -1);
    this_01 = (StepController *)*ppDVar5;
    DVar8 = (**(code **)(*(long *)this_01 + 0x20))();
  }
  this->frameAddrWhenSet = DVar8;
  uVar4 = GetScriptId(this_01,ptr);
  this->scriptIdWhenSet = uVar4;
  if (this->returnedValueList != (ReturnedValueList *)0x0) {
    return;
  }
  returnedValueList =
       JsUtil::
       List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
       New(this->pActivatedContext->recycler,4);
  this->returnedValueList = returnedValueList;
  ThreadContext::SetReturnedValueList(this->pActivatedContext->threadContext,returnedValueList);
  return;
}

Assistant:

void StepController::Activate(StepType stepType, InterpreterHaltState* haltState)
    {
        this->stepType = stepType;
        this->byteOffset = haltState->GetCurrentOffset();
        this->pActivatedContext = haltState->framePointers->Peek()->GetScriptContext();
        Assert(this->pActivatedContext);

        Js::FunctionBody* functionBody = haltState->GetFunction();

        this->body.Root(functionBody, this->pActivatedContext->GetRecycler());
        this->statementMap = body->GetMatchingStatementMapFromByteCode(byteOffset, false);
        this->frameCountWhenSet = haltState->framePointers->Count();

        if (stepType != STEP_DOCUMENT)
        {
            this->frameAddrWhenSet = (size_t)haltState->framePointers->Peek(0)->GetStackAddress();
        }
        else
        {
            // for doc mode, do not bail out automatically on frame changes
            this->frameAddrWhenSet = (size_t)-1;
        }

        this->scriptIdWhenSet = GetScriptId(functionBody);

        if (this->returnedValueList == nullptr)
        {
            this->returnedValueList = JsUtil::List<ReturnedValue*>::New(this->pActivatedContext->GetRecycler());
            this->pActivatedContext->GetThreadContext()->SetReturnedValueList(this->returnedValueList);
        }
    }